

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRefs.c
# Opt level: O0

Vec_Ptr_t * Abc_NodeMffcInsideCollect(Abc_Obj_t *pNode)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *vCone;
  int Count2;
  int Count1;
  Vec_Ptr_t *vInside;
  Abc_Obj_t *pNode_local;
  
  iVar1 = Abc_NodeDeref_rec(pNode);
  vCone = Vec_PtrAlloc(10);
  Abc_NodeMffcConeSupp(pNode,vCone,(Vec_Ptr_t *)0x0);
  iVar2 = Abc_NodeRef_rec(pNode);
  if (iVar1 == iVar2) {
    return vCone;
  }
  __assert_fail("Count1 == Count2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcRefs.c"
                ,0x189,"Vec_Ptr_t *Abc_NodeMffcInsideCollect(Abc_Obj_t *)");
}

Assistant:

Vec_Ptr_t * Abc_NodeMffcInsideCollect( Abc_Obj_t * pNode )
{
    Vec_Ptr_t * vInside;
    int Count1, Count2;
    // dereference the node
    Count1 = Abc_NodeDeref_rec( pNode );
    // collect the nodes inside the MFFC
    vInside = Vec_PtrAlloc( 10 );
    Abc_NodeMffcConeSupp( pNode, vInside, NULL );
    // reference it back
    Count2 = Abc_NodeRef_rec( pNode );
    assert( Count1 == Count2 );
    return vInside;
}